

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  int *piVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float *pfVar6;
  unsigned_short *puVar7;
  float fVar8;
  float fVar9;
  ImWchar IVar10;
  undefined2 uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  ImGuiContext *pIVar15;
  Glyph *pGVar16;
  Glyph *pGVar17;
  ulong uVar18;
  float *pfVar19;
  char *__function;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  uint uVar24;
  uint uVar25;
  float fVar26;
  
  uVar25 = (this->Glyphs).Size;
  if ((ulong)uVar25 == 0) {
    uVar22 = 1;
  }
  else {
    lVar20 = 0;
    uVar24 = 0;
    if (0 < (int)uVar25) {
      uVar24 = uVar25;
    }
    uVar22 = 0;
    do {
      if (uVar24 <= uVar25 - 1) {
        __function = "value_type &ImVector<ImFont::Glyph>::operator[](int) [T = ImFont::Glyph]";
        goto LAB_0015562d;
      }
      uVar2 = *(ushort *)((long)&((this->Glyphs).Data)->Codepoint + lVar20);
      if (uVar22 <= uVar2) {
        uVar22 = (uint)uVar2;
      }
      lVar20 = lVar20 + 0x28;
    } while ((ulong)uVar25 * 0x28 != lVar20);
    uVar22 = uVar22 + 1;
  }
  if (0xfffe < (int)uVar25) {
    __assert_fail("Glyphs.Size < 0xFFFF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                  ,0x6af,"void ImFont::BuildLookupTable()");
  }
  pfVar6 = (this->IndexXAdvance).Data;
  if (pfVar6 != (float *)0x0) {
    (this->IndexXAdvance).Size = 0;
    pIVar15 = GImGui;
    (this->IndexXAdvance).Capacity = 0;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
    (*(pIVar15->IO).MemFreeFn)(pfVar6);
    (this->IndexXAdvance).Data = (float *)0x0;
  }
  puVar7 = (this->IndexLookup).Data;
  if (puVar7 != (unsigned_short *)0x0) {
    (this->IndexLookup).Size = 0;
    pIVar15 = GImGui;
    (this->IndexLookup).Capacity = 0;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
    (*(pIVar15->IO).MemFreeFn)(puVar7);
    (this->IndexLookup).Data = (unsigned_short *)0x0;
  }
  GrowIndex(this,uVar22);
  iVar3 = (this->Glyphs).Size;
  lVar20 = (long)iVar3;
  if (0 < lVar20) {
    iVar4 = (this->IndexXAdvance).Size;
    pfVar6 = (this->IndexXAdvance).Data;
    iVar5 = (this->IndexLookup).Size;
    puVar7 = (this->IndexLookup).Data;
    pfVar19 = &((this->Glyphs).Data)->XAdvance;
    lVar23 = 0;
    do {
      if (iVar4 <= (int)(uint)((Glyph *)(pfVar19 + -1))->Codepoint) goto LAB_001555ea;
      uVar25 = (uint)((Glyph *)(pfVar19 + -1))->Codepoint;
      pfVar6[uVar25] = *pfVar19;
      if (iVar5 <= (int)uVar25) goto LAB_00155601;
      puVar7[uVar25] = (unsigned_short)lVar23;
      lVar23 = lVar23 + 1;
      pfVar19 = pfVar19 + 10;
    } while (lVar20 != lVar23);
  }
  pIVar15 = GImGui;
  if (((this->IndexLookup).Size < 0x21) || (uVar2 = (this->IndexLookup).Data[0x20], uVar2 == 0xffff)
     ) {
    pGVar17 = this->FallbackGlyph;
  }
  else {
    pGVar17 = (Glyph *)((long)&((this->Glyphs).Data)->Codepoint + (ulong)((uint)uVar2 * 0x28));
  }
  if (pGVar17 == (Glyph *)0x0) {
LAB_0015556b:
    this->FallbackGlyph = (Glyph *)0x0;
    if (((int)(uint)this->FallbackChar < (this->IndexLookup).Size) &&
       (uVar2 = (this->IndexLookup).Data[this->FallbackChar], uVar2 != 0xffff)) {
      pGVar17 = (Glyph *)((long)&((this->Glyphs).Data)->Codepoint + (ulong)((uint)uVar2 * 0x28));
    }
    else {
      pGVar17 = (Glyph *)0x0;
    }
    this->FallbackGlyph = pGVar17;
    fVar26 = 0.0;
    if (pGVar17 != (Glyph *)0x0) {
      fVar26 = pGVar17->XAdvance;
    }
    this->FallbackXAdvance = fVar26;
    uVar25 = (this->IndexXAdvance).Size;
    pfVar6 = (this->IndexXAdvance).Data;
    uVar21 = 0;
    uVar18 = (ulong)uVar25;
    if ((int)uVar25 < 1) {
      uVar18 = uVar21;
    }
    while (uVar18 != uVar21) {
      pfVar19 = pfVar6 + uVar21;
      if (*pfVar19 <= 0.0 && *pfVar19 != 0.0) {
        pfVar6[uVar21] = this->FallbackXAdvance;
      }
      uVar21 = uVar21 + 1;
      if (uVar22 == uVar21) {
        return;
      }
    }
  }
  else {
    if (iVar3 < 1) {
LAB_00155637:
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                    ,0x35d,"value_type &ImVector<ImFont::Glyph>::back() [T = ImFont::Glyph]");
    }
    if ((this->Glyphs).Data[lVar20 + -1].Codepoint != 9) {
      uVar25 = iVar3 + 1;
      iVar4 = (this->Glyphs).Capacity;
      if (iVar4 <= iVar3) {
        if (iVar4 == 0) {
          uVar24 = 8;
        }
        else {
          uVar24 = iVar4 / 2 + iVar4;
        }
        if ((int)uVar24 <= (int)uVar25) {
          uVar24 = uVar25;
        }
        if (iVar4 < (int)uVar24) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + 1;
          pGVar16 = (Glyph *)(*(pIVar15->IO).MemAllocFn)((ulong)uVar24 * 0x28);
          pGVar17 = (this->Glyphs).Data;
          if (pGVar17 != (Glyph *)0x0) {
            memcpy(pGVar16,pGVar17,(long)(this->Glyphs).Size * 0x28);
          }
          pGVar17 = (this->Glyphs).Data;
          if (pGVar17 != (Glyph *)0x0) {
            piVar1 = &(GImGui->IO).MetricsAllocs;
            *piVar1 = *piVar1 + -1;
          }
          (*(GImGui->IO).MemFreeFn)(pGVar17);
          (this->Glyphs).Data = pGVar16;
          (this->Glyphs).Capacity = uVar24;
        }
      }
      (this->Glyphs).Size = uVar25;
    }
    lVar20 = (long)(this->Glyphs).Size;
    if (lVar20 < 1) goto LAB_00155637;
    pGVar17 = (this->Glyphs).Data;
    if (((this->IndexLookup).Size < 0x21) ||
       (uVar2 = (this->IndexLookup).Data[0x20], uVar2 == 0xffff)) {
      pGVar16 = this->FallbackGlyph;
    }
    else {
      pGVar16 = (Glyph *)((long)&((this->Glyphs).Data)->Codepoint + (ulong)((uint)uVar2 * 0x28));
    }
    fVar26 = pGVar16->V1;
    pGVar17[lVar20 + -1].U1 = pGVar16->U1;
    pGVar17[lVar20 + -1].V1 = fVar26;
    IVar10 = pGVar16->Codepoint;
    uVar11 = *(undefined2 *)&pGVar16->field_0x2;
    fVar12 = pGVar16->XAdvance;
    fVar13 = pGVar16->X0;
    fVar14 = pGVar16->Y0;
    fVar26 = pGVar16->Y1;
    fVar8 = pGVar16->U0;
    fVar9 = pGVar16->V0;
    pGVar17[lVar20 + -1].X1 = pGVar16->X1;
    pGVar17[lVar20 + -1].Y1 = fVar26;
    pGVar17[lVar20 + -1].U0 = fVar8;
    pGVar17[lVar20 + -1].V0 = fVar9;
    pGVar16 = pGVar17 + lVar20 + -1;
    pGVar16->Codepoint = IVar10;
    *(undefined2 *)&pGVar16->field_0x2 = uVar11;
    pGVar16->XAdvance = fVar12;
    pGVar17[lVar20 + -1].X0 = fVar13;
    pGVar17[lVar20 + -1].Y0 = fVar14;
    pGVar17[lVar20 + -1].Codepoint = 9;
    fVar26 = pGVar17[lVar20 + -1].XAdvance * 4.0;
    pGVar17[lVar20 + -1].XAdvance = fVar26;
    if (9 < (this->IndexXAdvance).Size) {
      (this->IndexXAdvance).Data[9] = fVar26;
      if ((this->IndexLookup).Size < 10) {
LAB_00155601:
        __function = "value_type &ImVector<unsigned short>::operator[](int) [T = unsigned short]";
        goto LAB_0015562d;
      }
      (this->IndexLookup).Data[9] = (short)(this->Glyphs).Size - 1;
      goto LAB_0015556b;
    }
  }
LAB_001555ea:
  __function = "value_type &ImVector<float>::operator[](int) [T = float]";
LAB_0015562d:
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                ,0x353,__function);
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexXAdvance.clear();
    IndexLookup.clear();
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexXAdvance[codepoint] = Glyphs[i].XAdvance;
        IndexLookup[codepoint] = (unsigned short)i;
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((unsigned short)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times
            Glyphs.resize(Glyphs.Size + 1);
        ImFont::Glyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((unsigned short)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.XAdvance *= 4;
        IndexXAdvance[(int)tab_glyph.Codepoint] = (float)tab_glyph.XAdvance;
        IndexLookup[(int)tab_glyph.Codepoint] = (unsigned short)(Glyphs.Size-1);
    }

    FallbackGlyph = NULL;
    FallbackGlyph = FindGlyph(FallbackChar);
    FallbackXAdvance = FallbackGlyph ? FallbackGlyph->XAdvance : 0.0f;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexXAdvance[i] < 0.0f)
            IndexXAdvance[i] = FallbackXAdvance;
}